

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int write_file_descriptors(archive_write *a)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  long lStack_38;
  int r;
  int64_t offset;
  int64_t blocks;
  isofile *file;
  iso9660_conflict *iso9660;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  offset = 0;
  lStack_38 = 0;
  if ((*(long *)((long)pvVar1 + 0x10320) == 0) ||
     (a_local._4_4_ = make_boot_catalog(a), -1 < a_local._4_4_)) {
    if (*(long *)((long)pvVar1 + 0x10340) != 0) {
      lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x10340) + 0x18);
      offset = (int64_t)*(int *)(lVar2 + 0xa0);
      lStack_38 = *(long *)(lVar2 + 0x90);
      if (lStack_38 != 0) {
        iVar3 = write_file_contents(a,lStack_38,offset << 0xb);
        if (iVar3 < 0) {
          return iVar3;
        }
        offset = 0;
        lStack_38 = 0;
      }
    }
    for (blocks = *(int64_t *)((long)pvVar1 + 0x98); blocks != 0; blocks = *(int64_t *)(blocks + 8))
    {
      if (*(int *)(blocks + 0xb8) != 0) {
        if (lStack_38 + offset * 0x800 < *(long *)(blocks + 0x90)) {
          if ((0 < offset) && (iVar3 = write_file_contents(a,lStack_38,offset << 0xb), iVar3 < 0)) {
            return iVar3;
          }
          offset = 0;
          lStack_38 = *(long *)(blocks + 0x90);
        }
        *(int64_t *)(blocks + 0xb0) = blocks + 0x90;
        do {
          offset = *(int *)(*(long *)(blocks + 0xb0) + 0x10) + offset;
          *(undefined8 *)(blocks + 0xb0) = *(undefined8 *)(*(long *)(blocks + 0xb0) + 0x18);
        } while (*(long *)(blocks + 0xb0) != 0);
      }
    }
    if ((offset < 1) ||
       (a_local._4_4_ = write_file_contents(a,lStack_38,offset << 0xb), -1 < a_local._4_4_)) {
      a_local._4_4_ = 0;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
write_file_descriptors(struct archive_write *a)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isofile *file;
	int64_t blocks, offset;
	int r;

	blocks = 0;
	offset = 0;

	/* Make the boot catalog contents, and write it. */
	if (iso9660->el_torito.catalog != NULL) {
		r = make_boot_catalog(a);
		if (r < 0)
			return (r);
	}

	/* Write the boot file contents. */
	if (iso9660->el_torito.boot != NULL) {
		file = iso9660->el_torito.boot->file;
		blocks = file->content.blocks;
		offset = file->content.offset_of_temp;
		if (offset != 0) {
			r = write_file_contents(a, offset,
			    blocks << LOGICAL_BLOCK_BITS);
			if (r < 0)
				return (r);
			blocks = 0;
			offset = 0;
		}
	}

	/* Write out all file contents. */
	for (file = iso9660->data_file_list.first;
	    file != NULL; file = file->datanext) {

		if (!file->write_content)
			continue;

		if ((offset + (blocks << LOGICAL_BLOCK_BITS)) <
		     file->content.offset_of_temp) {
			if (blocks > 0) {
				r = write_file_contents(a, offset,
				    blocks << LOGICAL_BLOCK_BITS);
				if (r < 0)
					return (r);
			}
			blocks = 0;
			offset = file->content.offset_of_temp;
		}

		file->cur_content = &(file->content);
		do {
			blocks += file->cur_content->blocks;
			/* Next fragument */
			file->cur_content = file->cur_content->next;
		} while (file->cur_content != NULL);
	}

	/* Flush out remaining blocks. */
	if (blocks > 0) {
		r = write_file_contents(a, offset,
		    blocks << LOGICAL_BLOCK_BITS);
		if (r < 0)
			return (r);
	}

	return (ARCHIVE_OK);
}